

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiWindowSettings * ImGui::FindWindowSettings(ImGuiID id)

{
  ImGuiWindowSettings *pIVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(uint)(GImGui->SettingsWindows).Size;
  if (uVar2 != 0) {
    pIVar1 = (GImGui->SettingsWindows).Data;
    do {
      if (pIVar1->ID == id) {
        return pIVar1;
      }
      pIVar1 = pIVar1 + 1;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  return (ImGuiWindowSettings *)0x0;
}

Assistant:

ImGuiWindowSettings* ImGui::FindWindowSettings(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    for (int i = 0; i != g.SettingsWindows.Size; i++)
        if (g.SettingsWindows[i].ID == id)
            return &g.SettingsWindows[i];
    return NULL;
}